

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SR_binary.hh
# Opt level: O0

size_t OpenMesh::IO::
       binary<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
       ::store(ostream *param_1,value_type *param_2,bool param_3)

{
  ostream *poVar1;
  char *pcVar2;
  logic_error *this;
  byte in_DL;
  ostringstream msg;
  string local_1c0 [48];
  ostringstream local_190 [383];
  byte local_11;
  
  local_11 = in_DL & 1;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Type not supported: ");
  pcVar2 = std::type_info::name
                     ((type_info *)
                      &DefaultTraits::
                       VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>
                       ::typeinfo);
  std::operator<<(poVar1,pcVar2);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::logic_error::logic_error(this,local_1c0);
  __cxa_throw(this,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static 
  size_t store( std::ostream& /* _os */,
		const value_type& /* _v */,
		bool /* _swap=false */)
  { X; return 0; }